

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

float Rml::GetScrollOffsetDelta(ScrollAlignment alignment,float begin_offset,float end_offset)

{
  float end_offset_local;
  float begin_offset_local;
  ScrollAlignment alignment_local;
  
  switch(alignment) {
  case Start:
    begin_offset_local = begin_offset;
    break;
  case Center:
    begin_offset_local = (begin_offset + end_offset) / 2.0;
    break;
  case End:
    begin_offset_local = end_offset;
    break;
  case Nearest:
    if ((begin_offset < 0.0) || (0.0 < end_offset)) {
      if ((0.0 <= begin_offset) || (0.0 <= end_offset)) {
        if ((begin_offset <= 0.0) || (end_offset <= 0.0)) {
          begin_offset_local = 0.0;
        }
        else {
          begin_offset_local = Math::Min<float>(begin_offset,end_offset);
        }
      }
      else {
        begin_offset_local = Math::Max<float>(begin_offset,end_offset);
      }
    }
    else {
      begin_offset_local = 0.0;
    }
    break;
  default:
    begin_offset_local = 0.0;
  }
  return begin_offset_local;
}

Assistant:

static float GetScrollOffsetDelta(ScrollAlignment alignment, float begin_offset, float end_offset)
{
	switch (alignment)
	{
	case ScrollAlignment::Start: return begin_offset;
	case ScrollAlignment::Center: return (begin_offset + end_offset) / 2.0f;
	case ScrollAlignment::End: return end_offset;
	case ScrollAlignment::Nearest:
		if (begin_offset >= 0.f && end_offset <= 0.f)
			return 0.f; // Element is already visible, don't scroll
		else if (begin_offset < 0.f && end_offset < 0.f)
			return Math::Max(begin_offset, end_offset);
		else if (begin_offset > 0.f && end_offset > 0.f)
			return Math::Min(begin_offset, end_offset);
		else
			return 0.f; // Shouldn't happen
	}
	return 0.f;
}